

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::Worker::Run(Worker *this)

{
  int iVar1;
  pthread_mutex_t *ppVar2;
  bool bVar3;
  CURLMcode err;
  int iVar4;
  long lVar5;
  int *piVar6;
  iterator __position;
  EasyHandle *this_00;
  CurlException *this_01;
  uint __i;
  long lVar7;
  int iVar8;
  byte bVar9;
  ulong uVar10;
  int transfers_running;
  int maxfd;
  long sleep_duration;
  long local_208;
  int numLeft;
  Signaler *local_1f8;
  pthread_mutex_t *local_1f0;
  timeval local_1e8;
  string local_1d8;
  fd_set fdread;
  fd_set fdexcep;
  fd_set fdwrite;
  
  transfers_running = -1;
  fdread.fds_bits[0xe] = 0;
  fdread.fds_bits[0xf] = 0;
  fdread.fds_bits[0xc] = 0;
  fdread.fds_bits[0xd] = 0;
  fdread.fds_bits[10] = 0;
  fdread.fds_bits[0xb] = 0;
  fdread.fds_bits[8] = 0;
  fdread.fds_bits[9] = 0;
  fdread.fds_bits[6] = 0;
  fdread.fds_bits[7] = 0;
  fdread.fds_bits[4] = 0;
  fdread.fds_bits[5] = 0;
  fdread.fds_bits[2] = 0;
  fdread.fds_bits[3] = 0;
  fdread.fds_bits[0] = 0;
  fdread.fds_bits[1] = 0;
  fdwrite.fds_bits[0xe] = 0;
  fdwrite.fds_bits[0xf] = 0;
  fdwrite.fds_bits[0xc] = 0;
  fdwrite.fds_bits[0xd] = 0;
  fdwrite.fds_bits[10] = 0;
  fdwrite.fds_bits[0xb] = 0;
  fdwrite.fds_bits[8] = 0;
  fdwrite.fds_bits[9] = 0;
  fdwrite.fds_bits[6] = 0;
  fdwrite.fds_bits[7] = 0;
  fdwrite.fds_bits[4] = 0;
  fdwrite.fds_bits[5] = 0;
  fdwrite.fds_bits[2] = 0;
  fdwrite.fds_bits[3] = 0;
  fdwrite.fds_bits[0] = 0;
  fdwrite.fds_bits[1] = 0;
  fdexcep.fds_bits[0xe] = 0;
  fdexcep.fds_bits[0xf] = 0;
  fdexcep.fds_bits[0xc] = 0;
  fdexcep.fds_bits[0xd] = 0;
  fdexcep.fds_bits[10] = 0;
  fdexcep.fds_bits[0xb] = 0;
  fdexcep.fds_bits[8] = 0;
  fdexcep.fds_bits[9] = 0;
  fdexcep.fds_bits[6] = 0;
  fdexcep.fds_bits[7] = 0;
  fdexcep.fds_bits[4] = 0;
  fdexcep.fds_bits[5] = 0;
  fdexcep.fds_bits[2] = 0;
  fdexcep.fds_bits[3] = 0;
  fdexcep.fds_bits[0] = 0;
  fdexcep.fds_bits[1] = 0;
  local_208 = std::chrono::_V2::steady_clock::now();
  local_208 = local_208 + 60000000000;
  local_1f0 = (pthread_mutex_t *)&this->mutex_;
  local_1f8 = &this->signal_;
  bVar9 = 1;
  do {
    bVar3 = EvaluateState(this,transfers_running != 0,(bool)(bVar9 & 1));
    if (!bVar3) break;
    if ((bVar9 & 1) != 0) {
      Dequeue(this);
    }
    iVar8 = transfers_running;
    curl_multi_perform(this->handle_,&transfers_running);
    if ((transfers_running == 0) && (iVar8 == -1)) {
      transfers_running = -1;
LAB_0010ca2e:
      lVar5 = std::chrono::_V2::steady_clock::now();
      if (local_208 < lVar5) break;
    }
    else {
      if (transfers_running < 1) goto LAB_0010ca2e;
      local_208 = std::chrono::_V2::steady_clock::now();
      local_208 = local_208 + 60000000000;
    }
    numLeft = 0;
    while (piVar6 = (int *)curl_multi_info_read(this->handle_,&numLeft), ppVar2 = local_1f0,
          piVar6 != (int *)0x0) {
      __position = std::
                   _Rb_tree<void_*,_std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>,_std::_Select1st<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>_>
                   ::find(&(this->ongoing_)._M_t,(key_type *)(piVar6 + 2));
      if ((_Rb_tree_header *)__position._M_node ==
          &(this->ongoing_)._M_t._M_impl.super__Rb_tree_header) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                      ,0x3ed,"void restincurl::Worker::Run()");
      }
      Request::CallCompletion((Request *)__position._M_node[1]._M_parent,piVar6[4]);
      if (*piVar6 == 1) {
        curl_multi_remove_handle(this->handle_,*(key_type *)(piVar6 + 2));
      }
      this_00 = Request::GetEasyHandle((Request *)__position._M_node[1]._M_parent);
      EasyHandle::Close(this_00);
      std::
      _Rb_tree<void*,std::pair<void*const,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>,std::_Select1st<std::pair<void*const,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>>,std::less<void*>,std::allocator<std::pair<void*const,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>>>
      ::erase_abi_cxx11_((_Rb_tree<void*,std::pair<void*const,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>,std::_Select1st<std::pair<void*const,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>>,std::less<void*>,std::allocator<std::pair<void*const,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>>>
                          *)&this->ongoing_,__position);
    }
    std::mutex::lock((mutex *)&local_1f0->__data);
    if ((this->abort_ == false) && ((transfers_running != 0 || (this->close_pending_ == false)))) {
      iVar8 = 0;
      bVar3 = true;
    }
    else {
      bVar3 = false;
      iVar8 = 3;
    }
    pthread_mutex_unlock(ppVar2);
    if (bVar3) {
      lVar5 = std::chrono::_V2::steady_clock::now();
      sleep_duration = (local_208 - lVar5) / 1000000;
      if (sleep_duration < 2) {
        sleep_duration = 1;
      }
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
        fdread.fds_bits[lVar7] = 0;
      }
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
        fdwrite.fds_bits[lVar7] = 0;
      }
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
        fdexcep.fds_bits[lVar7] = 0;
      }
      maxfd = -1;
      iVar8 = -1;
      if (0 < transfers_running) {
        curl_multi_timeout(this->handle_,&sleep_duration,(local_208 - lVar5) % 1000000);
        if (sleep_duration < 0) {
          sleep_duration = 1000;
        }
        err = curl_multi_fdset(this->handle_,&fdread,&fdwrite,&fdexcep,&maxfd);
        if (err != CURLM_OK) {
          this_01 = (CurlException *)__cxa_allocate_exception(0x18);
          std::__cxx11::string::string
                    ((string *)&local_1d8,"curl_multi_fdset",(allocator *)&local_1e8);
          CurlException::CurlException(this_01,&local_1d8,err);
          __cxa_throw(this_01,&CurlException::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar8 = maxfd;
        if (maxfd == -1) {
          sleep_duration = 0x32;
          iVar8 = -1;
        }
      }
      local_1e8.tv_sec = sleep_duration / 1000;
      local_1e8.tv_usec = (sleep_duration % 1000) * 1000;
      iVar1 = (local_1f8->pipefd_)._M_elems[0];
      uVar10 = 1L << ((byte)iVar1 & 0x3f);
      fdread.fds_bits[iVar1 / 0x40] = fdread.fds_bits[iVar1 / 0x40] | uVar10;
      if (iVar8 < iVar1) {
        iVar8 = iVar1;
      }
      maxfd = iVar8 + 1;
      iVar4 = select(maxfd,(fd_set *)&fdread,(fd_set *)&fdwrite,(fd_set *)&fdexcep,&local_1e8);
      iVar8 = 0;
      if ((iVar4 < 1) || ((fdread.fds_bits[iVar1 / 0x40] & uVar10) == 0)) {
        bVar3 = false;
      }
      else {
        bVar3 = Signaler::WasSignalled(local_1f8);
      }
      bVar9 = bVar3 | this->pending_entries_in_queue_;
    }
    else {
      bVar9 = 0;
    }
  } while (iVar8 == 0);
  ppVar2 = local_1f0;
  std::mutex::lock((mutex *)&local_1f0->__data);
  if ((this->close_pending_ != false) || (this->abort_ == true)) {
    this->done_ = true;
  }
  pthread_mutex_unlock(ppVar2);
  return;
}

Assistant:

void Run() {
            int transfers_running = -1;
            fd_set fdread = {};
            fd_set fdwrite = {};
            fd_set fdexcep = {};
            bool do_dequeue = true;
            auto timeout = GetNextTimeout();

            while (EvaluateState(transfers_running, do_dequeue)) {

                if (do_dequeue) {
                    Dequeue();
                    do_dequeue = false;
                }

                /* timeout or readable/writable sockets */
                const bool initial_ideling = transfers_running == -1;
                curl_multi_perform(handle_, &transfers_running);
                if ((transfers_running == 0) && initial_ideling) {
                    transfers_running = -1; // Let's ignore close_pending_ until we have seen a request
                }

                // Shut down the thread if we have been idling too long
                if (transfers_running <= 0) {
                    if (timeout < std::chrono::steady_clock::now()) {
                        RESTINCURL_LOG("Idle timeout. Will shut down the worker-thread.");
                        break;
                    }
                } else {
                    timeout = GetNextTimeout();
                }

                int numLeft = {};
                while (auto m = curl_multi_info_read(handle_, &numLeft)) {
                    assert(m);
                    auto it = ongoing_.find(m->easy_handle);
                    if (it != ongoing_.end()) {
                        RESTINCURL_LOG("Finishing request with easy-handle: "
                            << (EasyHandle::handle_t)it->second->GetEasyHandle()
                            << "; with result: " << m->data.result << " expl: '" << curl_easy_strerror(m->data.result)
                            << "'; with msg: " << m->msg);

                        try {
                            it->second->Complete(m->data.result, m->msg);
                        } catch(const std::exception& ex) {
                            RESTINCURL_LOG("Complete threw: " << ex.what());
                        }
                        if (m->msg == CURLMSG_DONE) {
                            curl_multi_remove_handle(handle_, m->easy_handle);
                        }
                        it->second->GetEasyHandle().Close();
                        ongoing_.erase(it);
                    } else {
                        RESTINCURL_LOG("Failed to find easy_handle in ongoing!");
                        assert(false);
                    }
                }

                {
                    lock_t lock(mutex_);
                    // Avoid using select() as a timer when we need to exit anyway
                    if (abort_ || (!transfers_running && close_pending_)) {
                        break;
                    }
                }

                auto next_timeout = std::chrono::duration_cast<std::chrono::milliseconds>(
                    timeout - std::chrono::steady_clock::now());
                long sleep_duration = std::max<long>(1, next_timeout.count());
                /* extract sleep_duration value */


                FD_ZERO(&fdread);
                FD_ZERO(&fdwrite);
                FD_ZERO(&fdexcep);

                int maxfd = -1;
                if (transfers_running > 0) {
                    curl_multi_timeout(handle_, &sleep_duration);
                    if (sleep_duration < 0) {
                        sleep_duration = 1000;
                    }

                    /* get file descriptors from the transfers */
                    const auto mc = curl_multi_fdset(handle_, &fdread, &fdwrite, &fdexcep, &maxfd);
                    RESTINCURL_LOG_TRACE("maxfd: " << maxfd);
                    if (mc != CURLM_OK) {
                        throw CurlException("curl_multi_fdset", mc);
                    }

                    if (maxfd == -1) {
                        // Curl want's us to revisit soon
                        sleep_duration = 50;
                    }
                } // active transfers

                struct timeval tv = {};
                tv.tv_sec = sleep_duration / 1000;
                tv.tv_usec = (sleep_duration % 1000) * 1000;

                const auto signalfd = signal_.GetReadFd();

                RESTINCURL_LOG_TRACE("Calling select() with timeout of "
                    << sleep_duration
                    << " ms. Next timeout in " << next_timeout.count() << " ms. "
                    << transfers_running << " active transfers.");

                FD_SET(signalfd, &fdread);
                maxfd = std::max(signalfd,  maxfd) + 1;

                const auto rval = select(maxfd, &fdread, &fdwrite, &fdexcep, &tv);
                RESTINCURL_LOG_TRACE("select(" << maxfd << ") returned: " << rval);

                if (rval > 0) {
                    if (FD_ISSET(signalfd, &fdread)) {
                        RESTINCURL_LOG_TRACE("FD_ISSET was true: ");
                        do_dequeue = signal_.WasSignalled();
                    }

                }
                if (pending_entries_in_queue_) {
                    do_dequeue = true;
                }
            } // loop


            lock_t lock(mutex_);
            if (close_pending_ || abort_) {
                done_ = true;
            }
        }